

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::javanano::HasMapField(Descriptor *descriptor)

{
  int iVar1;
  long lVar2;
  Type TVar3;
  Descriptor *pDVar4;
  int i;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  for (lVar5 = 0; iVar1 = *(int *)(descriptor + 0x2c), lVar5 < iVar1; lVar5 = lVar5 + 1) {
    lVar2 = *(long *)(descriptor + 0x30);
    TVar3 = FieldDescriptor::type((FieldDescriptor *)(lVar2 + lVar6));
    if (TVar3 == TYPE_MESSAGE) {
      pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)(lVar2 + lVar6));
      if ((*(char *)(*(long *)(pDVar4 + 0x20) + 0x6b) == '\x01') &&
         (*(int *)(*(long *)(pDVar4 + 0x10) + 0x8c) == 3)) break;
    }
    lVar6 = lVar6 + 0xa8;
  }
  return lVar5 < iVar1;
}

Assistant:

bool HasMapField(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->type() == FieldDescriptor::TYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      return true;
    }
  }
  return false;
}